

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O0

AnalysisState __thiscall HttpData::analysisRequest(HttpData *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  long in_RDI;
  char *src_addr;
  void *mmapRet;
  int src_fd;
  stat sbuf;
  string filetype;
  int dot_pos;
  string header;
  string *in_stack_00000c50;
  int in_stack_00000c58;
  int in_stack_00000c5c;
  HttpData *in_stack_00000c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  allocator<char> *paVar5;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  undefined6 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae6;
  undefined1 in_stack_fffffffffffffae7;
  string *in_stack_fffffffffffffae8;
  string *suffix;
  bool local_4e2;
  bool local_4c1;
  allocator<char> local_491 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  allocator<char> local_461 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  allocator<char> local_431 [37];
  int local_40c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_361;
  stat local_340;
  allocator<char> local_2a9 [133];
  undefined4 local_224;
  string local_1d9 [3];
  int local_174;
  allocator<char> local_149 [134];
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1 [38];
  byte local_9b;
  byte local_9a;
  allocator<char> local_99 [33];
  _Self local_78;
  allocator<char> local_69 [33];
  _Self local_48 [8];
  AnalysisState local_4;
  
  if ((*(int *)(in_RDI + 0x78) == 1) ||
     ((*(int *)(in_RDI + 0x78) != 2 && (*(int *)(in_RDI + 0x78) != 3)))) {
    local_4 = ANALYSIS_ERROR;
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffaa0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
    std::allocator<char>::allocator();
    local_9a = 0;
    local_9b = 0;
    local_c2 = 0;
    local_c3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad0,
               (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (allocator<char> *)in_stack_fffffffffffffac0);
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffa88,(key_type *)0x1120d3);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffa88);
    bVar1 = std::operator==(local_48,&local_78);
    local_4c1 = false;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffad0,
                 (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 (allocator<char> *)in_stack_fffffffffffffac0);
      local_9b = 1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffad0,
                   (key_type *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      bVar1 = std::operator==(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
      local_4e2 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_c2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffad0,
                   (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                   (allocator<char> *)in_stack_fffffffffffffac0);
        local_c3 = 1;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffad0,
                     (key_type *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        local_4e2 = std::operator==(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
      }
      local_4c1 = local_4e2;
    }
    if ((local_c3 & 1) != 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
    }
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator(local_c1);
    }
    if ((local_9b & 1) != 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator(local_99);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffa90);
    std::allocator<char>::~allocator(local_69);
    if (local_4c1 != false) {
      *(undefined1 *)(in_RDI + 0xcc) = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffad0,
                 (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 (allocator<char> *)in_stack_fffffffffffffac0);
      std::operator+(in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     in_stack_fffffffffffffac0);
      std::operator+(in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::allocator<char>::~allocator(local_149);
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (in_stack_fffffffffffffad0,(char)((uint)in_stack_fffffffffffffacc >> 0x18),
                       (size_type)in_stack_fffffffffffffac0);
    local_174 = (int)sVar3;
    std::__cxx11::string::string(in_stack_fffffffffffffaa0);
    if (local_174 < 0) {
      suffix = local_1d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffad0,
                 (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 (allocator<char> *)in_stack_fffffffffffffac0);
      MimeType::getMime(suffix);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffae7,
                          CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)),
                 in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::allocator<char>::~allocator((allocator<char> *)local_1d9);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (size_type)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
      MimeType::getMime(in_stack_fffffffffffffae8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffae7,
                          CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)),
                 in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(in_stack_fffffffffffffa90);
    }
    bVar1 = std::operator==(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
      local_4 = ANALYSIS_SUCCESS;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
        std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        std::operator+((char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        std::operator+(in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        std::__cxx11::string::~string(in_stack_fffffffffffffa90);
        std::__cxx11::string::~string(in_stack_fffffffffffffa90);
        std::__cxx11::string::~string(in_stack_fffffffffffffa90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char*,void>
                  (in_stack_fffffffffffffab0,
                   (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                   (char *)in_stack_fffffffffffffaa0,(allocator<char> *)in_stack_fffffffffffffa98);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        std::__cxx11::string::~string(in_stack_fffffffffffffa90);
        std::allocator<char>::~allocator(local_2a9);
        local_4 = ANALYSIS_SUCCESS;
      }
      else {
        pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112ac0
                      );
        iVar2 = stat(pcVar4,&local_340);
        if (iVar2 < 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112ae6);
          uVar6 = *(undefined4 *)(in_RDI + 0x28);
          this_00 = &local_361;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,(char *)CONCAT44(uVar6,in_stack_fffffffffffffac8),
                     (allocator<char> *)in_stack_fffffffffffffac0);
          handleError(in_stack_00000c60,in_stack_00000c5c,in_stack_00000c58,in_stack_00000c50);
          std::__cxx11::string::~string(in_stack_fffffffffffffa90);
          std::allocator<char>::~allocator((allocator<char> *)&local_361);
          local_4 = ANALYSIS_ERROR;
        }
        else {
          std::operator+((char *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
          std::operator+(in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          std::__cxx11::string::~string(in_stack_fffffffffffffa90);
          std::__cxx11::string::~string(in_stack_fffffffffffffa90);
          std::__cxx11::to_string((long)in_stack_fffffffffffffad8);
          std::operator+((char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          std::operator+(in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          std::__cxx11::string::~string(in_stack_fffffffffffffa90);
          std::__cxx11::string::~string(in_stack_fffffffffffffa90);
          std::__cxx11::string::~string(in_stack_fffffffffffffa90);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          if (*(int *)(in_RDI + 0x78) == 3) {
            local_4 = ANALYSIS_SUCCESS;
          }
          else {
            pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x112df8);
            iVar2 = open(pcVar4,0);
            local_40c = iVar2;
            if (iVar2 < 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x112e36);
              paVar5 = local_431;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffad0,(char *)CONCAT44(in_stack_fffffffffffffacc,iVar2)
                         ,paVar5);
              handleError(in_stack_00000c60,in_stack_00000c5c,in_stack_00000c58,in_stack_00000c50);
              std::__cxx11::string::~string(in_stack_fffffffffffffa90);
              std::allocator<char>::~allocator(local_431);
              local_4 = ANALYSIS_ERROR;
            }
            else {
              local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          mmap((void *)0x0,local_340.st_size,1,2,iVar2,0);
              close(local_40c);
              if (local_440 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0xffffffffffffffff) {
                munmap((void *)0xffffffffffffffff,local_340.st_size);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112f88)
                ;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffad0,
                           (char *)CONCAT44(in_stack_fffffffffffffacc,iVar2),
                           (allocator<char> *)in_stack_fffffffffffffac0);
                handleError(in_stack_00000c60,in_stack_00000c5c,in_stack_00000c58,in_stack_00000c50)
                ;
                std::__cxx11::string::~string(in_stack_fffffffffffffa90);
                std::allocator<char>::~allocator(local_461);
                local_4 = ANALYSIS_ERROR;
              }
              else {
                local_470 = local_440;
                __a = (allocator<char> *)((long)&(local_440->_M_dataplus)._M_p + local_340.st_size);
                paVar5 = local_491;
                in_stack_fffffffffffffa90 = local_440;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<char*,void>
                          (in_stack_fffffffffffffab0,
                           (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                           (char *)paVar5,__a);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
                std::__cxx11::string::~string(in_stack_fffffffffffffa90);
                std::allocator<char>::~allocator(local_491);
                munmap(local_440,local_340.st_size);
                local_4 = ANALYSIS_SUCCESS;
              }
            }
          }
        }
      }
    }
    local_224 = 1;
    std::__cxx11::string::~string(in_stack_fffffffffffffa90);
    std::__cxx11::string::~string(in_stack_fffffffffffffa90);
  }
  return local_4;
}

Assistant:

AnalysisState HttpData::analysisRequest() {
  if (method_ == METHOD_POST) {
    // ------------------------------------------------------
    // My CV stitching handler which requires OpenCV library
    // ------------------------------------------------------
    // string header;
    // header += string("HTTP/1.1 200 OK\r\n");
    // if(headers_.find("Connection") != headers_.end() &&
    // headers_["Connection"] == "Keep-Alive")
    // {
    //     keepAlive_ = true;
    //     header += string("Connection: Keep-Alive\r\n") + "Keep-Alive:
    //     timeout=" + to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    // }
    // int length = stoi(headers_["Content-length"]);
    // vector<char> data(inBuffer_.begin(), inBuffer_.begin() + length);
    // Mat src = imdecode(data, CV_LOAD_IMAGE_ANYDEPTH|CV_LOAD_IMAGE_ANYCOLOR);
    // //imwrite("receive.bmp", src);
    // Mat res = stitch(src);
    // vector<uchar> data_encode;
    // imencode(".png", res, data_encode);
    // header += string("Content-length: ") + to_string(data_encode.size()) +
    // "\r\n\r\n";
    // outBuffer_ += header + string(data_encode.begin(), data_encode.end());
    // inBuffer_ = inBuffer_.substr(length);
    // return ANALYSIS_SUCCESS;
  } else if (method_ == METHOD_GET || method_ == METHOD_HEAD) {
    string header;
    header += "HTTP/1.1 200 OK\r\n";
    if (headers_.find("Connection") != headers_.end() &&
        (headers_["Connection"] == "Keep-Alive" ||
         headers_["Connection"] == "keep-alive")) {
      keepAlive_ = true;
      header += string("Connection: Keep-Alive\r\n") + "Keep-Alive: timeout=" +
                to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    }
    int dot_pos = fileName_.find('.');
    string filetype;
    if (dot_pos < 0)
      filetype = MimeType::getMime("default");
    else
      filetype = MimeType::getMime(fileName_.substr(dot_pos));

    // echo test
    if (fileName_ == "hello") {
      outBuffer_ =
          "HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World";
      return ANALYSIS_SUCCESS;
    }
    if (fileName_ == "favicon.ico") {
      header += "Content-Type: image/png\r\n";
      header += "Content-Length: " + to_string(sizeof favicon) + "\r\n";
      header += "Server: LinYa's Web Server\r\n";

      header += "\r\n";
      outBuffer_ += header;
      outBuffer_ += string(favicon, favicon + sizeof favicon);
      ;
      return ANALYSIS_SUCCESS;
    }

    struct stat sbuf;
    if (stat(fileName_.c_str(), &sbuf) < 0) {
      header.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    header += "Content-Type: " + filetype + "\r\n";
    header += "Content-Length: " + to_string(sbuf.st_size) + "\r\n";
    header += "Server: LinYa's Web Server\r\n";
    // 头部结束
    header += "\r\n";
    outBuffer_ += header;

    if (method_ == METHOD_HEAD) return ANALYSIS_SUCCESS;

    int src_fd = open(fileName_.c_str(), O_RDONLY, 0);
    if (src_fd < 0) {
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    void *mmapRet = mmap(NULL, sbuf.st_size, PROT_READ, MAP_PRIVATE, src_fd, 0);
    close(src_fd);
    if (mmapRet == (void *)-1) {
      munmap(mmapRet, sbuf.st_size);
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    char *src_addr = static_cast<char *>(mmapRet);
    outBuffer_ += string(src_addr, src_addr + sbuf.st_size);
    ;
    munmap(mmapRet, sbuf.st_size);
    return ANALYSIS_SUCCESS;
  }
  return ANALYSIS_ERROR;
}